

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

ostream * Json::operator<<(ostream *sout,Value *root)

{
  size_t in_RCX;
  StyledStreamWriter writer;
  allocator local_a1;
  string local_a0;
  StyledStreamWriter local_80;
  
  std::__cxx11::string::string((string *)&local_a0,"\t",&local_a1);
  StyledStreamWriter::StyledStreamWriter(&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  StyledStreamWriter::write(&local_80,(int)sout,root,in_RCX);
  StyledStreamWriter::~StyledStreamWriter(&local_80);
  return sout;
}

Assistant:

std::ostream& operator<<(std::ostream& sout, const Value& root) {
  Json::StyledStreamWriter writer;
  writer.write(sout, root);
  return sout;
}